

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  reference value;
  ulong uVar4;
  string *psVar5;
  size_t sVar6;
  long lVar7;
  int cached_size;
  BayesianProbitRegressor_FeatureWeight *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  BayesianProbitRegressor *this_local;
  
  iVar2 = _internal_features_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = google::protobuf::
           RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::begin
                     (&this->features_);
  msg = (BayesianProbitRegressor_FeatureWeight *)
        google::protobuf::
        RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::end
                  (&this->features_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                 ::operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
            ::operator*(&__end2);
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>(value);
    sStack_18 = sVar6 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::
    operator++(&__end2);
  }
  _internal_regressioninputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_regressioninputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_optimisminputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_optimisminputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_samplingscaleinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_samplingtruncationinputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  _internal_meanoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_meanoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_varianceoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_varianceoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_pessimisticprobabilityoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    psVar5 = _internal_sampledprobabilityoutputfeaturename_abi_cxx11_(this);
    sVar6 = google::protobuf::internal::WireFormatLite::StringSize(psVar5);
    sStack_18 = sVar6 + 2 + sStack_18;
  }
  bVar1 = _internal_has_bias(this);
  if (bVar1) {
    sVar6 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BayesianProbitRegressor_Gaussian>(this->bias_);
    sStack_18 = sVar6 + 1 + sStack_18;
  }
  uVar3 = _internal_numberoffeatures(this);
  if (uVar3 != 0) {
    uVar3 = _internal_numberoffeatures(this);
    sVar6 = google::protobuf::internal::WireFormatLite::UInt32SizePlusOne(uVar3);
    sStack_18 = sVar6 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar7 = std::__cxx11::string::size();
    sStack_18 = lVar7 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  total_size += 1UL * this->_internal_features_size();
  for (const auto& msg : this->features_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32SizePlusOne(this->_internal_numberoffeatures());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}